

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

LY_ERR lyds_merge_nodes2_front
                 (lyd_node **leader_dst,lyd_node **first_src,lyd_node *leader_src,rb_node **rbt_src,
                 rb_node **dst_iter,lyd_node **next_p)

{
  lyd_node *plVar1;
  lyd_node *local_60;
  lyd_node *dst;
  rb_node *iter;
  rb_node *prev;
  LY_ERR ret;
  lyd_node **next_p_local;
  rb_node **dst_iter_local;
  rb_node **rbt_src_local;
  lyd_node *leader_src_local;
  lyd_node **first_src_local;
  lyd_node **leader_dst_local;
  
  leader_dst_local._4_4_ = rb_insert(*leader_dst,rbt_src,dst_iter);
  if (leader_dst_local._4_4_ == LY_SUCCESS) {
    plVar1 = (lyd_node *)rb_prev(*dst_iter);
    local_60 = *leader_dst;
    for (dst = plVar1; dst != (lyd_node *)0x0; dst = (lyd_node *)rb_prev((rb_node *)dst)) {
      lyd_unlink_ignore_lyds(first_src,dst->next);
      lyd_insert_before_node(local_60,dst->next);
      lyd_insert_hash(dst->next);
      local_60 = dst->next;
    }
    if (plVar1 != (lyd_node *)0x0) {
      *leader_dst = local_60;
    }
    leader_dst_local._4_4_ = LY_SUCCESS;
  }
  else {
    *next_p = leader_src;
  }
  return leader_dst_local._4_4_;
}

Assistant:

static LY_ERR
lyds_merge_nodes2_front(struct lyd_node **leader_dst, struct lyd_node **first_src, struct lyd_node *leader_src,
        struct rb_node **rbt_src, struct rb_node **dst_iter, struct lyd_node **next_p)
{
    LY_ERR ret;
    struct rb_node *prev, *iter;
    struct lyd_node *dst;

    /* insert destination leader */
    ret = rb_insert(*leader_dst, rbt_src, dst_iter);
    LY_CHECK_ERR_RET(ret, *next_p = leader_src, ret);

    /* iterate over source RB tree and move the nodes belonging before destination leader */
    prev = rb_prev(*dst_iter);
    dst = *leader_dst;
    for (iter = prev; iter; iter = rb_prev(iter)) {
        lyd_unlink_ignore_lyds(first_src, RBN_DNODE(iter));
        lyd_insert_before_node(dst, RBN_DNODE(iter));
        lyd_insert_hash(RBN_DNODE(iter));
        dst = RBN_DNODE(iter);
    }
    if (prev) {
        *leader_dst = dst;
    }

    return LY_SUCCESS;
}